

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TriConnectivity.cc
# Opt level: O2

bool __thiscall OpenMesh::TriConnectivity::is_collapse_ok(TriConnectivity *this,HalfedgeHandle v0v1)

{
  bool bVar1;
  VertexHandle _vh;
  VertexHandle _vh_00;
  HalfedgeHandle HVar2;
  value_type vVar3;
  StatusInfo *pSVar4;
  BaseHandle BVar5;
  HalfedgeHandle _heh;
  VertexVertexIter local_70;
  GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::VertexHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toVertexHandle>
  local_58;
  BaseHandle local_40;
  BaseHandle local_3c;
  BaseHandle local_38;
  BaseHandle local_34;
  
  pSVar4 = ArrayKernel::status((ArrayKernel *)this,
                               (EdgeHandle)((int)v0v1.super_BaseHandle.idx_ >> 1));
  if ((pSVar4->status_ & 1) == 0) {
    _heh.super_BaseHandle.idx_ =
         (BaseHandle)
         ((-((uint)v0v1.super_BaseHandle.idx_ & 1) | 1) + (int)v0v1.super_BaseHandle.idx_);
    _vh = ArrayKernel::to_vertex_handle((ArrayKernel *)this,_heh);
    _vh_00 = ArrayKernel::to_vertex_handle((ArrayKernel *)this,v0v1);
    pSVar4 = ArrayKernel::status((ArrayKernel *)this,_vh);
    if (((pSVar4->status_ & 1) == 0) &&
       (pSVar4 = ArrayKernel::status((ArrayKernel *)this,_vh_00), (pSVar4->status_ & 1) == 0)) {
      bVar1 = ArrayKernel::is_boundary((ArrayKernel *)this,v0v1);
      local_40.idx_ = -1;
      local_3c.idx_ = local_40.idx_;
      local_38 = _vh.super_BaseHandle.idx_;
      if (!bVar1) {
        HVar2 = ArrayKernel::next_halfedge_handle((ArrayKernel *)this,v0v1);
        local_34.idx_ = (int)ArrayKernel::next_halfedge_handle((ArrayKernel *)this,HVar2);
        local_40.idx_ = (int)ArrayKernel::to_vertex_handle((ArrayKernel *)this,HVar2);
        bVar1 = ArrayKernel::is_boundary
                          ((ArrayKernel *)this,
                           (HalfedgeHandle)
                           ((-((uint)HVar2.super_BaseHandle.idx_ & 1) | 1) +
                           (int)HVar2.super_BaseHandle.idx_));
        if ((bVar1) &&
           (bVar1 = ArrayKernel::is_boundary
                              ((ArrayKernel *)this,
                               (HalfedgeHandle)((-(local_34.idx_ & 1U) | 1) + local_34.idx_)), bVar1
           )) {
          return false;
        }
      }
      BVar5.idx_ = local_38.idx_;
      bVar1 = ArrayKernel::is_boundary((ArrayKernel *)this,_heh);
      if (!bVar1) {
        HVar2 = ArrayKernel::next_halfedge_handle((ArrayKernel *)this,_heh);
        local_34.idx_ = (int)ArrayKernel::next_halfedge_handle((ArrayKernel *)this,HVar2);
        local_3c.idx_ = (int)ArrayKernel::to_vertex_handle((ArrayKernel *)this,HVar2);
        bVar1 = ArrayKernel::is_boundary
                          ((ArrayKernel *)this,
                           (HalfedgeHandle)
                           ((-((uint)HVar2.super_BaseHandle.idx_ & 1) | 1) +
                           (int)HVar2.super_BaseHandle.idx_));
        BVar5.idx_ = local_38.idx_;
        if ((bVar1) &&
           (bVar1 = ArrayKernel::is_boundary
                              ((ArrayKernel *)this,
                               (HalfedgeHandle)((-(local_34.idx_ & 1U) | 1) + local_34.idx_)),
           BVar5.idx_ = local_38.idx_, bVar1)) {
          return false;
        }
      }
      if (local_40.idx_ != local_3c.idx_) {
        local_58.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>._20_4_ = 0xffffffff;
        local_34 = _vh_00.super_BaseHandle.idx_;
        PolyConnectivity::vv_iter(&local_70,&this->super_PolyConnectivity,(VertexHandle)BVar5.idx_);
        local_58.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.mesh_ =
             local_70.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.mesh_;
        local_58.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.start_.super_BaseHandle.
        idx_ = local_70.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.start_.
               super_BaseHandle.idx_;
        local_58.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.heh_.super_BaseHandle.idx_
             = local_70.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.heh_.
               super_BaseHandle.idx_;
        local_58.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.lap_counter_ =
             local_70.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.lap_counter_;
        while ((local_58.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.heh_.
                super_BaseHandle.idx_ != -1 &&
               ((local_58.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.start_.
                 super_BaseHandle.idx_ !=
                 local_58.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.heh_.
                 super_BaseHandle.idx_ ||
                (local_58.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.lap_counter_ == 0
                ))))) {
          vVar3 = Iterators::
                  GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::VertexHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toVertexHandle>
                  ::operator*(&local_58);
          pSVar4 = ArrayKernel::status((ArrayKernel *)this,(VertexHandle)vVar3.super_BaseHandle.idx_
                                      );
          *(byte *)&pSVar4->status_ = (byte)pSVar4->status_ & 0xdf;
          Iterators::
          GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::VertexHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toVertexHandle>
          ::operator++(&local_58);
        }
        PolyConnectivity::vv_iter
                  (&local_70,&this->super_PolyConnectivity,(VertexHandle)local_34.idx_);
        local_58.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.mesh_ =
             local_70.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.mesh_;
        local_58.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.start_.super_BaseHandle.
        idx_ = local_70.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.start_.
               super_BaseHandle.idx_;
        local_58.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.heh_.super_BaseHandle.idx_
             = local_70.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.heh_.
               super_BaseHandle.idx_;
        local_58.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.lap_counter_ =
             local_70.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.lap_counter_;
        while ((local_58.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.heh_.
                super_BaseHandle.idx_ != -1 &&
               ((local_58.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.start_.
                 super_BaseHandle.idx_ !=
                 local_58.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.heh_.
                 super_BaseHandle.idx_ ||
                (local_58.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.lap_counter_ == 0
                ))))) {
          vVar3 = Iterators::
                  GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::VertexHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toVertexHandle>
                  ::operator*(&local_58);
          pSVar4 = ArrayKernel::status((ArrayKernel *)this,(VertexHandle)vVar3.super_BaseHandle.idx_
                                      );
          *(byte *)&pSVar4->status_ = (byte)pSVar4->status_ | 0x20;
          Iterators::
          GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::VertexHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toVertexHandle>
          ::operator++(&local_58);
        }
        PolyConnectivity::vv_iter
                  (&local_70,&this->super_PolyConnectivity,(VertexHandle)local_38.idx_);
        BVar5.idx_ = local_34.idx_;
        local_58.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.mesh_ =
             local_70.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.mesh_;
        local_58.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.start_.super_BaseHandle.
        idx_ = local_70.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.start_.
               super_BaseHandle.idx_;
        local_58.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.heh_.super_BaseHandle.idx_
             = local_70.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.heh_.
               super_BaseHandle.idx_;
        local_58.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.lap_counter_ =
             local_70.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.lap_counter_;
        while ((local_58.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.heh_.
                super_BaseHandle.idx_ != -1 &&
               ((local_58.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.start_.
                 super_BaseHandle.idx_ !=
                 local_58.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.heh_.
                 super_BaseHandle.idx_ ||
                (local_58.super_GenericCirculatorBaseT<OpenMesh::PolyConnectivity>.lap_counter_ == 0
                ))))) {
          vVar3 = Iterators::
                  GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::VertexHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toVertexHandle>
                  ::operator*(&local_58);
          pSVar4 = ArrayKernel::status((ArrayKernel *)this,(VertexHandle)vVar3.super_BaseHandle.idx_
                                      );
          if (((pSVar4->status_ & 0x20) != 0) &&
             ((vVar3 = Iterators::
                       GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::VertexHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toVertexHandle>
                       ::operator*(&local_58),
              vVar3.super_BaseHandle.idx_ != (BaseHandle)local_40.idx_ &&
              (vVar3 = Iterators::
                       GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::VertexHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toVertexHandle>
                       ::operator*(&local_58),
              vVar3.super_BaseHandle.idx_ != (BaseHandle)local_3c.idx_)))) {
            return false;
          }
          Iterators::
          GenericCirculatorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::VertexHandle,_&OpenMesh::Iterators::GenericCirculatorBaseT<OpenMesh::PolyConnectivity>::toVertexHandle>
          ::operator++(&local_58);
        }
        bVar1 = PolyConnectivity::is_boundary
                          (&this->super_PolyConnectivity,(VertexHandle)local_38.idx_);
        if ((((!bVar1) ||
             (bVar1 = PolyConnectivity::is_boundary
                                (&this->super_PolyConnectivity,(VertexHandle)BVar5.idx_), !bVar1))
            || (bVar1 = ArrayKernel::is_boundary((ArrayKernel *)this,v0v1), bVar1)) ||
           (bVar1 = ArrayKernel::is_boundary((ArrayKernel *)this,_heh), bVar1)) {
          return true;
        }
      }
    }
  }
  return false;
}

Assistant:

bool TriConnectivity::is_collapse_ok(HalfedgeHandle v0v1)
{
  // is the edge already deleted?
  if ( status(edge_handle(v0v1)).deleted() )
    return false;

  HalfedgeHandle  v1v0(opposite_halfedge_handle(v0v1));
  VertexHandle    v0(to_vertex_handle(v1v0));
  VertexHandle    v1(to_vertex_handle(v0v1));

  // are vertices already deleted ?
  if (status(v0).deleted() || status(v1).deleted())
    return false;

  VertexHandle    vl, vr;
  HalfedgeHandle  h1, h2;

  // the edges v1-vl and vl-v0 must not be both boundary edges
  if (!is_boundary(v0v1))
  {

    h1 = next_halfedge_handle(v0v1);
    h2 = next_halfedge_handle(h1);

    vl = to_vertex_handle(h1);

    if (is_boundary(opposite_halfedge_handle(h1)) &&
        is_boundary(opposite_halfedge_handle(h2)))
    {
      return false;
    }
  }


  // the edges v0-vr and vr-v1 must not be both boundary edges
  if (!is_boundary(v1v0))
  {

    h1 = next_halfedge_handle(v1v0);
    h2 = next_halfedge_handle(h1);

    vr = to_vertex_handle(h1);

    if (is_boundary(opposite_halfedge_handle(h1)) &&
        is_boundary(opposite_halfedge_handle(h2)))
      return false;
  }

  // if vl and vr are equal or both invalid -> fail
  if (vl == vr) return false;

  VertexVertexIter  vv_it;

  // test intersection of the one-rings of v0 and v1
  for (vv_it = vv_iter(v0); vv_it.is_valid(); ++vv_it)
    status(*vv_it).set_tagged(false);

  for (vv_it = vv_iter(v1); vv_it.is_valid(); ++vv_it)
    status(*vv_it).set_tagged(true);

  for (vv_it = vv_iter(v0); vv_it.is_valid(); ++vv_it)
    if (status(*vv_it).tagged() && *vv_it != vl && *vv_it != vr)
      return false;


  // edge between two boundary vertices should be a boundary edge
  if ( is_boundary(v0) && is_boundary(v1) &&
       !is_boundary(v0v1) && !is_boundary(v1v0))
    return false;

  // passed all tests
  return true;
}